

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O2

string * __thiscall
magic_enum::containers::
bitset<Color,magic_enum::containers::detail::indexing<Color,std::less<Color>,void>>::
to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,char_type sep)

{
  Color pos;
  bool bVar1;
  long lVar2;
  enable_if_t<Color,_string_view> eVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    pos = *(Color *)((long)&magic_enum::detail::values_v<Color,(magic_enum::detail::enum_subtype)1>
                    + lVar2);
    bVar1 = bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
            ::test((bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                    *)this,pos);
    if (bVar1) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        Catch::clara::std::__cxx11::
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,1,sep);
      }
      eVar3 = enum_name<Color,(magic_enum::detail::enum_subtype)1>(pos);
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::append(__return_storage_ptr__,eVar3._M_str,eVar3._M_len);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] string to_string(char_type sep = static_cast<char_type>('|')) const {
    string name;

    for (const auto& e : enum_values<E>()) {
      if (test(e)) {
        if (!name.empty()) {
          name.append(1, sep);
        }
        auto n = enum_name(e);
        name.append(n.data(), n.size());
      }
    }
    return name;
  }